

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::_next_node(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  undefined8 extraout_RAX;
  long lVar11;
  char *pcVar12;
  basic_substring<const_char> *pbVar13;
  ulong uVar14;
  byte bVar15;
  csubstr cVar16;
  char msg [46];
  size_t idx;
  basic_substring<const_char> local_178;
  char local_168 [56];
  undefined2 local_130;
  undefined1 local_12e;
  _lookup_path_token local_120;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<const_char> local_40;
  
  bVar15 = 0;
  _next_token(&local_120,this,r,parent);
  if (local_120.type.type == NOTYPE) {
    return 0xffffffffffffffff;
  }
  sVar9 = local_120.value.len;
  switch(local_120.type.type) {
  case KEY:
    if ((((local_120.value.len == 0) || (local_120.value.len == 0)) || (*local_120.value.str != '[')
        ) || (local_120.value.str[local_120.value.len - 1] != ']')) {
      pcVar12 = "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pbVar13 = &local_178;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        pbVar13->str = *(char **)pcVar12;
        pcVar12 = pcVar12 + ((ulong)bVar15 * -2 + 1) * 8;
        pbVar13 = (basic_substring<const_char> *)&pbVar13[-(ulong)bVar15].len;
      }
      local_12e = 0;
      local_130 = 0x2929;
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_e0 = 0;
      uStack_d8 = 0x6920;
      local_d0 = 0;
      pcStack_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c0 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6920) << 0x40);
      LVar6.name.str._0_4_ = 0x250b5d;
      LVar6.super_LineCol.offset = auVar3._0_8_;
      LVar6.super_LineCol.line = auVar3._8_8_;
      LVar6.super_LineCol.col = auVar3._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x4b,LVar6,(this->m_callbacks).m_user_data);
    }
    if (sVar9 == 0) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      handle_error(0x250c0a,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1560,"left >= 0 && left <= len");
    }
    basic_substring<const_char>::basic_substring(&local_178,local_120.value.str + 1,sVar9 - 2);
    local_40.str = local_178.str;
    local_40.len = local_178.len;
    local_178 = basic_substring<const_char>::triml(&local_40,' ');
    local_120.value = basic_substring<const_char>::trimr(&local_178,' ');
    local_40.str = (char *)0x0;
    cVar16.len = (size_t)&local_40;
    cVar16.str = (char *)local_120.value.len;
    bVar8 = atou<unsigned_long>((c4 *)local_120.value.str,cVar16,(unsigned_long *)&local_40);
    if (!bVar8) {
      builtin_strncpy(local_168,"om_chars(token.value, &idx)",0x1c);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = 'f';
      local_178.len._7_1_ = 'r';
      local_178.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_108 = 0;
      uStack_100 = 0x6923;
      local_f8 = 0;
      pcStack_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e8 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6923) << 0x40);
      LVar7.name.str._0_4_ = 0x250b5d;
      LVar7.super_LineCol.offset = auVar3._0_8_;
      LVar7.super_LineCol.line = auVar3._8_8_;
      LVar7.super_LineCol.col = auVar3._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x2c,LVar7,(this->m_callbacks).m_user_data);
    }
    sVar10 = child(this,r->closest,(size_t)local_40.str);
    goto LAB_002192a4;
  case KEYVAL:
    cVar16 = lookup_result::unresolved(r);
    if (cVar16.str != (char *)0x0 && cVar16.len != 0) {
      builtin_strncpy(local_168,"->unresolved().empty())",0x18);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = 'r';
      local_178.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_b8 = 0;
      uStack_b0 = 0x691a;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x691a) << 0x40);
      LVar5.name.str._0_4_ = 0x250b5d;
      LVar5.super_LineCol.offset = auVar3._0_8_;
      LVar5.super_LineCol.line = auVar3._8_8_;
      LVar5.super_LineCol.col = auVar3._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x28,LVar5,(this->m_callbacks).m_user_data);
    }
    uVar14 = r->closest;
    if ((uVar14 == 0xffffffffffffffff) || (this->m_cap <= uVar14)) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_178 = (basic_substring<const_char>)(ZEXT816(0x4b86) << 0x40);
      local_168[0] = '\0';
      local_168[1] = '\0';
      local_168[2] = '\0';
      local_168[3] = '\0';
      local_168[4] = '\0';
      local_168[5] = '\0';
      local_168[6] = '\0';
      local_168[7] = '\0';
      local_168[8] = ']';
      local_168[9] = '\v';
      local_168[10] = '%';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = 0;
      local_168[0xf] = '\0';
      local_168[0x10] = 'e';
      local_168[0x11] = '\0';
      local_168[0x12] = '\0';
      local_168[0x13] = 0;
      local_168[0x14] = '\0';
      local_168[0x15] = '\0';
      local_168[0x16] = '\0';
      local_168[0x17] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    sVar10 = 0xffffffffffffffff;
    if ((this->m_buf[uVar14].m_type.type & MAP) == NOTYPE) goto LAB_002192a4;
    break;
  case MAP:
  case SEQ:
    if ((local_120.value.len != 0) && (*local_120.value.str == '[')) {
      builtin_strncpy(local_168,"token.value.begins_with(\'[\'))",0x1e);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = '!';
      local_178.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_68 = 0;
      uStack_60 = 0x6913;
      local_58 = 0;
      pcStack_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6913) << 0x40);
      LVar2.name.str._0_4_ = 0x250b5d;
      LVar2.super_LineCol.offset = auVar3._0_8_;
      LVar2.super_LineCol.line = auVar3._8_8_;
      LVar2.super_LineCol.col = auVar3._16_8_;
      LVar2.name.str._4_4_ = 0;
      LVar2.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x2e,LVar2,(this->m_callbacks).m_user_data);
    }
    uVar14 = r->closest;
    if ((uVar14 == 0xffffffffffffffff) || (this->m_cap <= uVar14)) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_178 = (basic_substring<const_char>)(ZEXT816(0x4b86) << 0x40);
      local_168[0] = '\0';
      local_168[1] = '\0';
      local_168[2] = '\0';
      local_168[3] = '\0';
      local_168[4] = '\0';
      local_168[5] = '\0';
      local_168[6] = '\0';
      local_168[7] = '\0';
      local_168[8] = ']';
      local_168[9] = '\v';
      local_168[10] = '%';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = 0;
      local_168[0xf] = '\0';
      local_168[0x10] = 'e';
      local_168[0x11] = '\0';
      local_168[0x12] = '\0';
      local_168[0x13] = 0;
      local_168[0x14] = '\0';
      local_168[0x15] = '\0';
      local_168[0x16] = '\0';
      local_168[0x17] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar14].m_type.type & MAP) == NOTYPE) {
      builtin_strncpy(local_168,"s_map(r->closest))",0x13);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = 'i';
      local_178.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      local_90 = 0;
      uStack_88 = 0x6915;
      local_80 = 0;
      pcStack_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_70 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6915) << 0x40);
      LVar4.name.str._0_4_ = 0x250b5d;
      LVar4.super_LineCol.offset = auVar3._0_8_;
      LVar4.super_LineCol.line = auVar3._8_8_;
      LVar4.super_LineCol.col = auVar3._16_8_;
      LVar4.name.str._4_4_ = 0;
      LVar4.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x23,LVar4,(this->m_callbacks).m_user_data);
    }
    break;
  default:
    _next_node();
    __clang_call_terminate(extraout_RAX);
  }
  sVar10 = find_child(this,r->closest,&local_120.value);
LAB_002192a4:
  if (sVar10 == 0xffffffffffffffff) {
    uVar14 = 0;
    if (r->path_pos != 0) {
      uVar14 = r->path_pos - 1;
    }
    if ((r->path).len < uVar14) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar9 = (*pcVar1)();
        return sVar9;
      }
      handle_error(0x250c0a,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_178,(r->path).str + uVar14,(r->path).len - uVar14);
    sVar9 = r->path_pos - sVar9;
    r->path_pos = sVar9;
    if ((local_178.len != 0) && (*local_178.str == '.')) {
      r->path_pos = sVar9 - 1;
    }
  }
  else {
    (parent->type).type = local_120.type.type;
    (parent->value).str = local_120.value.str;
    (parent->value).len = local_120.value.len;
  }
  return sVar10;
}

Assistant:

size_t Tree::_next_node(lookup_result * r, _lookup_path_token *parent) const
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    csubstr prev = token.value;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
        node = find_child(r->closest, token.value);
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
            node = find_child(r->closest, token.value);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx = 0;
        _RYML_CB_CHECK(m_callbacks, from_chars(token.value, &idx));
        node = child(r->closest, idx);
    }
    else
    {
        C4_NEVER_REACH();
    }

    if(node != NONE)
    {
        *parent = token;
    }
    else
    {
        csubstr p = r->path.sub(r->path_pos > 0 ? r->path_pos - 1 : r->path_pos);
        r->path_pos -= prev.len;
        if(p.begins_with('.'))
            r->path_pos -= 1u;
    }

    return node;
}